

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

double __thiscall tetgenmesh::incircle3d(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  double dVar1;
  double dVar2;
  double local_c0;
  double d;
  double r;
  double sign;
  double c [3];
  double local_88;
  double n2 [3];
  double local_68;
  double n1 [3];
  double area2 [2];
  point pd_local;
  point pc_local;
  point pb_local;
  point pa_local;
  tetgenmesh *this_local;
  
  facenormal(this,pa,pb,pc,&local_68,1,(double *)0x0);
  dVar1 = dot(this,&local_68,&local_68);
  facenormal(this,pb,pa,pd,&local_88,1,(double *)0x0);
  dVar2 = dot(this,&local_88,&local_88);
  if (dVar1 <= dVar2) {
    if (dVar2 <= 0.0) {
      return 0.0;
    }
    circumsphere(this,pb,pa,pd,(double *)0x0,&sign,&d);
    local_c0 = distance(this,&sign,pc);
  }
  else {
    circumsphere(this,pa,pb,pc,(double *)0x0,&sign,&d);
    local_c0 = distance(this,&sign,pd);
  }
  r = local_c0 - d;
  if (ABS(r) / d < this->b->epsilon) {
    r = 0.0;
  }
  return r;
}

Assistant:

REAL tetgenmesh::incircle3d(point pa, point pb, point pc, point pd)
{
  REAL area2[2], n1[3], n2[3], c[3];
  REAL sign, r, d;

  // Calculate the areas of the two triangles [a, b, c] and [b, a, d].
  facenormal(pa, pb, pc, n1, 1, NULL);
  area2[0] = dot(n1, n1);
  facenormal(pb, pa, pd, n2, 1, NULL);
  area2[1] = dot(n2, n2);

  if (area2[0] > area2[1]) {
    // Choose [a, b, c] as the base triangle.
    circumsphere(pa, pb, pc, NULL, c, &r);
    d = distance(c, pd);
  } else {
    // Choose [b, a, d] as the base triangle.
    if (area2[1] > 0) {
      circumsphere(pb, pa, pd, NULL, c, &r);
      d = distance(c, pc);
    } else {
      // The four points are collinear. This case only happens on the boundary.
      return 0; // Return "not inside".
    }
  }

  sign = d - r;
  if (fabs(sign) / r < b->epsilon) {
    sign = 0;
  }

  return sign;
}